

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_char_to_fixnum(asmcode *code,compiler_options *ops)

{
  skiwi *this;
  uint64_t lab;
  operand local_cc;
  operation local_c8;
  operand local_c4 [2];
  operation local_bc [2];
  operand local_b4 [2];
  operation local_ac [3];
  operand local_a0 [2];
  operation local_98 [2];
  operand local_90 [2];
  operation local_88;
  operand local_84 [2];
  operation local_7c [3];
  operand local_70 [2];
  operation local_68 [4];
  string local_58;
  undefined1 local_38 [8];
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  error.field_2._8_8_ = ops;
  std::__cxx11::string::string((string *)local_38);
  this = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,this,lab);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_68[0] = CMP;
    local_70[1] = 0x14;
    local_70[0] = NUMBER;
    local_7c[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_68,local_70 + 1,local_70,(int *)(local_7c + 2));
    local_7c[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_7c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    local_7c[0] = MOV;
    local_84[1] = 0x14;
    local_84[0] = RCX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_7c,local_84 + 1,local_84);
    local_88 = AND;
    local_90[1] = 0x14;
    local_90[0] = NUMBER;
    local_98[1] = 0xff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_88,local_90 + 1,local_90,(int *)(local_98 + 1));
    local_98[0] = CMP;
    local_a0[1] = 0x14;
    local_a0[0] = NUMBER;
    local_ac[2] = 0x17;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_98,local_a0 + 1,local_a0,(int *)(local_ac + 2));
    local_ac[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_ac + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  local_ac[0] = SHR;
  local_b4[1] = 0xb;
  local_b4[0] = NUMBER;
  local_bc[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_ac,local_b4 + 1,local_b4,(int *)(local_bc + 1));
  local_bc[0] = MOV;
  local_c4[1] = 9;
  local_c4[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_bc,local_c4 + 1,local_c4);
  local_c8 = JMP;
  local_cc = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_c8,&local_cc);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    error_label(code,(string *)local_38,re_char_to_fixnum_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_char_to_fixnum(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    code.add(asmcode::MOV, asmcode::R11, asmcode::RCX);
    code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, char_mask);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, char_tag);
    code.add(asmcode::JNES, error);
    }

  code.add(asmcode::SHR, asmcode::RCX, asmcode::NUMBER, 7);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::JMP, CONTINUE);

  if (ops.safe_primitives)
    {
    error_label(code, error, re_char_to_fixnum_contract_violation);
    }
  }